

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetPrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *file_descriptor,Descriptor *containing_type)

{
  size_type *psVar1;
  undefined8 *puVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar3;
  Descriptor *descriptor;
  undefined8 uVar4;
  ulong uVar5;
  undefined1 local_50 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  GetNamespace_abi_cxx11_((string *)&local_30,this,options,file_descriptor);
  GetNestedMessageName_abi_cxx11_
            ((string *)local_50,(_anonymous_namespace_ *)containing_type,descriptor);
  uVar4 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_allocated_capacity != &local_20) {
    uVar4 = local_20._M_allocated_capacity;
  }
  if ((ulong)uVar4 < (ulong)(local_50._8_8_ + local_30._8_8_)) {
    uVar5 = 0xf;
    if ((string *)local_50._0_8_ != (string *)(local_50 + 0x10)) {
      uVar5 = local_50._16_8_;
    }
    if ((ulong)(local_50._8_8_ + local_30._8_8_) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_50,0,(char *)0x0,local_30._M_allocated_capacity);
      goto LAB_0025e40b;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_30._M_local_buf,local_50._0_8_);
LAB_0025e40b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar1) {
    uVar4 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar1;
  puVar2[1] = 0;
  *(undefined1 *)psVar1 = 0;
  psVar3 = (string *)(local_50 + 0x10);
  if ((string *)local_50._0_8_ != psVar3) {
    operator_delete((void *)local_50._0_8_);
    psVar3 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_allocated_capacity != &local_20) {
    operator_delete((void *)local_30._M_allocated_capacity);
    psVar3 = extraout_RAX_00;
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return psVar3;
}

Assistant:

std::string GetPrefix(const GeneratorOptions& options,
                      const FileDescriptor* file_descriptor,
                      const Descriptor* containing_type) {
  std::string prefix = GetNamespace(options, file_descriptor) +
                       GetNestedMessageName(containing_type);
  if (!prefix.empty()) {
    prefix += ".";
  }
  return prefix;
}